

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

void __thiscall
djb::matrix::transform
          (matrix *this,vector<double,_std::allocator<double>_> *v,
          vector<double,_std::allocator<double>_> *out)

{
  iterator __position;
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double local_38;
  
  std::vector<double,_std::allocator<double>_>::resize(out,0);
  if (0 < this->size) {
    lVar7 = 0;
    lVar5 = 0;
    do {
      local_38 = 0.0;
      __position._M_current =
           (out->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (out->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (out,__position,&local_38);
      }
      else {
        *__position._M_current = 0.0;
        (out->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
      lVar4 = (long)this->size;
      if (0 < lVar4) {
        pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar2 = (out->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        dVar8 = pdVar2[lVar5];
        pdVar3 = (this->mij).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar6 = 0;
        do {
          dVar8 = dVar8 + *(double *)((long)pdVar3 + lVar6 * 8 + lVar7 * lVar4) * pdVar1[lVar6];
          pdVar2[lVar5] = dVar8;
          lVar6 = lVar6 + 1;
        } while (lVar4 != lVar6);
      }
      lVar5 = lVar5 + 1;
      lVar7 = lVar7 + 8;
    } while (lVar5 < this->size);
  }
  return;
}

Assistant:

void
matrix::transform(const std::vector<double> &v, std::vector<double> &out) const
{
	out.resize(0);

	for (int j = 0; j < size; ++j) {
		out.push_back(0);

		for (int i = 0; i < size; ++i) {
			out[j]+= (*this)(i, j) * v[i];
		}
	}
}